

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::DeadReckoningCalculator(DeadReckoningCalculator *this)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar7;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_initPosition);
  DATA_TYPE::Vector::Vector(&this->m_initLinearVelocity);
  DATA_TYPE::Vector::Vector(&this->m_initLinearAcceleration);
  DATA_TYPE::Vector::Vector(&this->m_Ab);
  DATA_TYPE::Vector::Vector(&this->m_quatAxis);
  this->m_f64Magnitude = 0.0;
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initOrientation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initEulerAngularVelocity);
  auVar11 = _DAT_001beef0;
  auVar1 = _DAT_001beed0;
  pfVar2 = (this->m_initOrientationMatrix).Data[0] + 1;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar10 = auVar11;
    do {
      auVar9 = auVar10 ^ auVar1;
      bVar8 = auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffffd;
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5 + -4) = uVar12;
      }
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 + -4 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5) = uVar12;
      }
      auVar9 = _DAT_001beef0;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
    pfVar2 = pfVar2 + 3;
  } while (lVar4 != 3);
  pfVar2 = (this->m_initOrientationMatrixTranspose).Data[0] + 1;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar11 = auVar9;
    do {
      auVar10 = auVar11 ^ auVar1;
      bVar8 = auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffffd;
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5 + -4) = uVar12;
      }
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 + -4 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5) = uVar12;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
    pfVar2 = pfVar2 + 3;
  } while (lVar4 != 3);
  DATA_TYPE::Vector::Vector(&this->m_initAngularVelocity);
  auVar11 = _DAT_001beef0;
  auVar1 = _DAT_001beed0;
  pfVar2 = (this->m_wwMatrix).Data[0] + 1;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar9 = auVar11;
    do {
      auVar10 = auVar9 ^ auVar1;
      bVar8 = auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffffd;
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5 + -4) = uVar12;
      }
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 + -4 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5) = uVar12;
      }
      auVar10 = _DAT_001beef0;
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
    pfVar2 = pfVar2 + 3;
  } while (lVar4 != 3);
  pfVar2 = (this->m_SkewOmegaMatrix).Data[0] + 1;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = auVar10;
    do {
      auVar11 = auVar6 ^ auVar1;
      bVar8 = auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffffd;
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5 + -4) = uVar12;
      }
      if (bVar8) {
        uVar12 = 0x3f800000;
        if (lVar3 + -4 != lVar5) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar5) = uVar12;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
    pfVar2 = pfVar2 + 3;
  } while (lVar4 != 3);
  this->m_DRA = Other_DRA;
  return;
}

Assistant:

DeadReckoningCalculator::DeadReckoningCalculator() :
    m_f64Magnitude( 0 ),
    m_DRA( Other_DRA )
{
}